

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void compact_with_reopen_test(void)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  void *pvVar3;
  fdb_doc *pfVar4;
  fdb_status fVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  size_t bodylen;
  ulong uVar9;
  char *__format;
  long lVar10;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_doc *rdoc;
  fdb_kvs_handle *second_dbh;
  fdb_file_handle *second_dbfile;
  fdb_kvs_config kvs_config;
  fdb_file_info info;
  timeval __test_begin;
  fdb_config fconfig;
  fdb_doc *pfStack_758;
  size_t *local_750;
  char metabuf [256];
  char bodybuf [256];
  char keybuf [256];
  char temp [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0x1000000;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fdb_open(&dbfile,"./compact_test1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fVar5 = fdb_set_log_callback(db,logCallbackFunc,"compact_with_reopen_test");
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x17e);
    compact_with_reopen_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x17e,"void compact_with_reopen_test()");
  }
  lVar10 = 0;
  for (uVar9 = 0; uVar9 != 100; uVar9 = uVar9 + 1) {
    sprintf(keybuf,"key%d",uVar9 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar9 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar9 & 0xffffffff);
    sVar7 = strlen(keybuf);
    sVar8 = strlen(metabuf);
    bodylen = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)&pfStack_758 + lVar10),keybuf,sVar7,metabuf,sVar8,bodybuf,
                   bodylen);
    fdb_set(db,(&pfStack_758)[uVar9]);
    lVar10 = lVar10 + 8;
  }
  fdb_doc_create(&rdoc,(void *)local_750[4],*local_750,(void *)local_750[7],local_750[1],(void *)0x0
                 ,0);
  rdoc->deleted = true;
  fdb_set(db,rdoc);
  fdb_doc_free(rdoc);
  fdb_commit(dbfile,'\x01');
  fdb_compact(dbfile,"./compact_test2");
  fdb_kvs_close(db);
  fdb_close(dbfile);
  system("mv  compact_test2 compact_test1 > errorlog.txt");
  fdb_open(&dbfile,"./compact_test1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fVar5 = fdb_set_log_callback(db,logCallbackFunc,"compact_with_reopen_test");
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x1a0);
    compact_with_reopen_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x1a0,"void compact_with_reopen_test()");
  }
  for (lVar10 = 0; lVar10 != 100; lVar10 = lVar10 + 1) {
    fdb_doc_create(&rdoc,(&pfStack_758)[lVar10]->key,(&pfStack_758)[lVar10]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    fVar5 = fdb_get(db,rdoc);
    pfVar4 = rdoc;
    if (lVar10 == 1) {
      if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x1ad);
        compact_with_reopen_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x1ad,"void compact_with_reopen_test()");
      }
    }
    else {
      if (fVar5 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x1a9);
        compact_with_reopen_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x1a9,"void compact_with_reopen_test()");
      }
      pvVar1 = rdoc->meta;
      pfVar2 = (&pfStack_758)[lVar10];
      pvVar3 = pfVar2->meta;
      iVar6 = bcmp(pvVar1,pvVar3,rdoc->metalen);
      if (iVar6 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x1aa);
        compact_with_reopen_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x1aa,"void compact_with_reopen_test()");
      }
      pvVar1 = pfVar4->body;
      pvVar3 = pfVar2->body;
      iVar6 = bcmp(pvVar1,pvVar3,pfVar4->bodylen);
      if (iVar6 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x1ab);
        compact_with_reopen_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x1ab,"void compact_with_reopen_test()");
      }
    }
    fdb_doc_free(pfVar4);
  }
  fdb_get_file_info(dbfile,&info);
  iVar6 = strcmp("./compact_test1",info.filename);
  if (iVar6 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
           );
    compact_with_reopen_test()::__test_pass = '\x01';
    iVar6 = strcmp("./compact_test1",info.filename);
    if (iVar6 != 0) {
      __assert_fail("!strcmp(\"./compact_test1\", info.filename)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x1b6,"void compact_with_reopen_test()");
    }
  }
  lVar10 = 0;
  for (uVar9 = 0; uVar9 != 100; uVar9 = uVar9 + 1) {
    sprintf(metabuf,"newmeta%d",uVar9 & 0xffffffff);
    sprintf(bodybuf,"newbody%d_%s",uVar9 & 0xffffffff,temp);
    sVar7 = strlen(metabuf);
    sVar8 = strlen(bodybuf);
    fdb_doc_update((fdb_doc **)((long)&pfStack_758 + lVar10),metabuf,sVar7,bodybuf,sVar8);
    fdb_set(db,(&pfStack_758)[uVar9]);
    lVar10 = lVar10 + 8;
  }
  fdb_open(&second_dbfile,"./compact_test1",&fconfig);
  fdb_kvs_open_default(second_dbfile,&second_dbh,&kvs_config);
  fVar5 = fdb_set_log_callback(second_dbh,logCallbackFunc,"compact_with_reopen_test");
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x1c8);
    compact_with_reopen_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x1c8,"void compact_with_reopen_test()");
  }
  fVar5 = fdb_compact(dbfile,(char *)0x0);
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x1cb);
    compact_with_reopen_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x1cb,"void compact_with_reopen_test()");
  }
  fVar5 = fdb_compact(dbfile,(char *)0x0);
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x1ce);
    compact_with_reopen_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x1ce,"void compact_with_reopen_test()");
  }
  fVar5 = fdb_compact(dbfile,(char *)0x0);
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x1d2);
    compact_with_reopen_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x1d2,"void compact_with_reopen_test()");
  }
  fdb_kvs_close(db);
  fdb_close(dbfile);
  for (lVar10 = 0; lVar10 != 100; lVar10 = lVar10 + 1) {
    fdb_doc_create(&rdoc,(&pfStack_758)[lVar10]->key,(&pfStack_758)[lVar10]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    fVar5 = fdb_get(second_dbh,rdoc);
    pfVar4 = rdoc;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x1db);
      compact_with_reopen_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x1db,"void compact_with_reopen_test()");
    }
    pvVar1 = rdoc->meta;
    pfVar2 = (&pfStack_758)[lVar10];
    pvVar3 = pfVar2->meta;
    iVar6 = bcmp(pvVar1,pvVar3,rdoc->metalen);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x1dc);
      compact_with_reopen_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x1dc,"void compact_with_reopen_test()");
    }
    pvVar1 = pfVar4->body;
    pvVar3 = pfVar2->body;
    iVar6 = bcmp(pvVar1,pvVar3,pfVar4->bodylen);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x1dd);
      compact_with_reopen_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x1dd,"void compact_with_reopen_test()");
    }
    fdb_doc_free(pfVar4);
  }
  fVar5 = fdb_open(&dbfile,"./compact_test1",&fconfig);
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x1e4);
    compact_with_reopen_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x1e4,"void compact_with_reopen_test()");
  }
  fVar5 = fdb_kvs_open_default(dbfile,&db,&kvs_config);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    fVar5 = fdb_set_log_callback(db,logCallbackFunc,"compact_with_reopen_test");
    if (fVar5 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x1e9);
      compact_with_reopen_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x1e9,"void compact_with_reopen_test()");
    }
    fdb_get_file_info(dbfile,&info);
    iVar6 = strcmp("./compact_test1.3",info.filename);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
             );
      compact_with_reopen_test()::__test_pass = '\x01';
      iVar6 = strcmp("./compact_test1.3",info.filename);
      if (iVar6 != 0) {
        __assert_fail("!strcmp(\"./compact_test1.3\", info.filename)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x1ec,"void compact_with_reopen_test()");
      }
    }
    fdb_kvs_close(second_dbh);
    fdb_close(second_dbfile);
    for (lVar10 = 0; lVar10 != 100; lVar10 = lVar10 + 1) {
      fdb_doc_create(&rdoc,(&pfStack_758)[lVar10]->key,(&pfStack_758)[lVar10]->keylen,(void *)0x0,0,
                     (void *)0x0,0);
      fVar5 = fdb_get(db,rdoc);
      pfVar4 = rdoc;
      if (fVar5 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x1f5);
        compact_with_reopen_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x1f5,"void compact_with_reopen_test()");
      }
      pvVar1 = rdoc->meta;
      pfVar2 = (&pfStack_758)[lVar10];
      pvVar3 = pfVar2->meta;
      iVar6 = bcmp(pvVar1,pvVar3,rdoc->metalen);
      if (iVar6 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x1f6);
        compact_with_reopen_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x1f6,"void compact_with_reopen_test()");
      }
      pvVar1 = pfVar4->body;
      pvVar3 = pfVar2->body;
      iVar6 = bcmp(pvVar1,pvVar3,pfVar4->bodylen);
      if (iVar6 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x1f7);
        compact_with_reopen_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x1f7,"void compact_with_reopen_test()");
      }
      fdb_doc_free(pfVar4);
    }
    fdb_compact(dbfile,(char *)0x0);
    fdb_kvs_close(db);
    fdb_close(dbfile);
    system("mv  compact_test1 compact_test.fdb > errorlog.txt");
    fdb_open(&dbfile,"./compact_test.fdb",&fconfig);
    fdb_kvs_open_default(dbfile,&db,&kvs_config);
    fVar5 = fdb_set_log_callback(db,logCallbackFunc,"compact_with_reopen_test");
    if (fVar5 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x206);
      compact_with_reopen_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x206,"void compact_with_reopen_test()");
    }
    fdb_compact(dbfile,(char *)0x0);
    fdb_kvs_close(db);
    fdb_close(dbfile);
    fVar5 = fdb_open(&dbfile,"./compact_test.fdb",&fconfig);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      fVar5 = fdb_kvs_open_default(dbfile,&db,&kvs_config);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x20f);
        compact_with_reopen_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x20f,"void compact_with_reopen_test()");
      }
      fVar5 = fdb_set_log_callback(db,logCallbackFunc,"compact_with_reopen_test");
      if (fVar5 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x212);
        compact_with_reopen_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x212,"void compact_with_reopen_test()");
      }
      fdb_get_file_info(dbfile,&info);
      iVar6 = strcmp("./compact_test.fdb",info.filename);
      if (iVar6 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x214);
        compact_with_reopen_test()::__test_pass = '\x01';
        iVar6 = strcmp("./compact_test.fdb",info.filename);
        if (iVar6 != 0) {
          __assert_fail("!strcmp(\"./compact_test.fdb\", info.filename)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x214,"void compact_with_reopen_test()");
        }
      }
      if (info.doc_count != 100) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x215);
        compact_with_reopen_test()::__test_pass = '\x01';
        if (info.doc_count != 100) {
          __assert_fail("info.doc_count == 100",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x215,"void compact_with_reopen_test()");
        }
      }
      for (lVar10 = 0; lVar10 != 100; lVar10 = lVar10 + 1) {
        fdb_doc_free((&pfStack_758)[lVar10]);
      }
      fdb_kvs_close(db);
      fdb_close(dbfile);
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (compact_with_reopen_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"compaction with reopen test");
      return;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x20d);
    compact_with_reopen_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x20d,"void compact_with_reopen_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0x1e6);
  compact_with_reopen_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x1e6,"void compact_with_reopen_test()");
}

Assistant:

void compact_with_reopen_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 100;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256], temp[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove doc
    fdb_doc_create(&rdoc, doc[1]->key, doc[1]->keylen, doc[1]->meta, doc[1]->metalen, NULL, 0);
    rdoc->deleted = true;
    fdb_set(db, rdoc);
    fdb_doc_free(rdoc);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // perform compaction using one handle
    fdb_compact(dbfile, (char *) "./compact_test2");

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    r = system(SHELL_MOVE " compact_test2 compact_test1 > errorlog.txt");
    (void)r;
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // retrieve documents using the other handle without close/re-open
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 1) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        }else{
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
    }
    // check the other handle's filename
    fdb_file_info info;
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(!strcmp("./compact_test1", info.filename));

    // update documents
    for (i=0;i<n;++i){
        sprintf(metabuf, "newmeta%d", i);
        sprintf(bodybuf, "newbody%d_%s", i, temp);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
                       (void *)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // Open the database with another handle.
    fdb_file_handle *second_dbfile;
    fdb_kvs_handle *second_dbh;
    fdb_open(&second_dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(second_dbfile, &second_dbh, &kvs_config);
    status = fdb_set_log_callback(second_dbh, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // In-place compactions with a handle still open on the first old file
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // MB-12977: retest compaction again..
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_close(db);
    fdb_close(dbfile);

    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(second_dbh, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        // free result document
        fdb_doc_free(rdoc);
    }

    // Open database with an original name.
    status = fdb_open(&dbfile, "./compact_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_get_file_info(dbfile, &info);
    // The actual file name should be a compacted one.
    TEST_CHK(!strcmp("./compact_test1.3", info.filename));

    fdb_kvs_close(second_dbh);
    fdb_close(second_dbfile);

    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        // free result document
        fdb_doc_free(rdoc);
    }

    fdb_compact(dbfile, NULL);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    r = system(SHELL_MOVE " compact_test1 compact_test.fdb > errorlog.txt");
    (void)r;
    fdb_open(&dbfile, "./compact_test.fdb", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // In-place compaction
    fdb_compact(dbfile, NULL);
    fdb_kvs_close(db);
    fdb_close(dbfile);
    // Open database with an original name.
    status = fdb_open(&dbfile, "./compact_test.fdb", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(!strcmp("./compact_test.fdb", info.filename));
    TEST_CHK(info.doc_count == 100);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compaction with reopen test");
}